

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerHeuristic.cpp
# Opt level: O1

void __thiscall Memory::RecyclerHeuristic::RecyclerHeuristic(RecyclerHeuristic *this)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  undefined4 *puVar5;
  uint uVar6;
  undefined1 local_60 [8];
  MEMORYSTATUSEX mem;
  
  local_60._0_4_ = 0x40;
  BVar3 = GlobalMemoryStatusEx((LPMEMORYSTATUSEX)local_60);
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerHeuristic.cpp"
                       ,0x1e,"(isSuccess)","isSuccess");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  if (BVar3 != 0) {
    bVar2 = AutoSystemInfo::IsLowMemoryDevice();
    if ((ulong)mem._0_8_ < 0x20000001 && bVar2) {
      this->DefaultMaxAllocPageCount = 0x20;
      this->DefaultMaxFreePageCount = 0x1000;
      iVar4 = 0x10;
      goto LAB_00735032;
    }
  }
  if ((ulong)mem._0_8_ < 0x40000001 && BVar3 != 0) {
    this->DefaultMaxAllocPageCount = 0x40;
    this->DefaultMaxFreePageCount = 0x4000;
    iVar4 = 0x40;
  }
  else {
    this->DefaultMaxAllocPageCount = 0x100;
    this->DefaultMaxFreePageCount = 0x20000;
    iVar4 = 0xc0;
  }
LAB_00735032:
  uVar6 = iVar4 * 0x100000;
  this->MaxUncollectedAllocBytes = uVar6;
  this->UncollectedAllocBytesConcurrentPriorityBoost = (ulong)uVar6;
  this->MaxPartialUncollectedNewPageCount = iVar4 << 8;
  this->MaxUncollectedAllocBytesOnExit = iVar4 << 0x13;
  this->MaxUncollectedAllocBytesPartialCollect = uVar6 - 0x100000;
  return;
}

Assistant:

RecyclerHeuristic::RecyclerHeuristic()
{
    ::MEMORYSTATUSEX mem;
    mem.dwLength = sizeof(mem);
    BOOL isSuccess = ::GlobalMemoryStatusEx(&mem);
    Assert(isSuccess);

    DWORDLONG physicalMemoryBytes = mem.ullTotalPhys;
    uint baseFactor;

    // xplat-todo: Android sysconf is rather unreliable,
    // ullTotalPhys may not be the best source for a decision below
    if (isSuccess && AutoSystemInfo::IsLowMemoryDevice() && physicalMemoryBytes <= 512 MEGABYTES)
    {
        // Low-end Apollo (512MB RAM) scenario.
        // Note that what's specific about Apollo is that IE runs in physical memory,
        //      that's one reason to distinguish 512MB Apollo from 512MB desktop.
        baseFactor = 16;
        this->DefaultMaxFreePageCount = 16 MEGABYTES_OF_PAGES;
        this->DefaultMaxAllocPageCount = 32;
    }
    else if (isSuccess && physicalMemoryBytes <= 1024 MEGABYTES)
    {
        // Tablet/slate/high-end Apollo scenario, including 512MB non-Apollo.
        baseFactor = 64;
        this->DefaultMaxFreePageCount = 64 MEGABYTES_OF_PAGES;
        this->DefaultMaxAllocPageCount = 64;
    }
    else
    {
        // Regular desktop scenario.
        baseFactor = 192;
        this->DefaultMaxFreePageCount = 512 MEGABYTES_OF_PAGES;
        this->DefaultMaxAllocPageCount = 256;
    }

    this->ConfigureBaseFactor(baseFactor);
}